

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

bool __thiscall
Lib::
DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
::insert(DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this,pair<Kernel::Literal_*,_Kernel::Clause_*> key,IndexEntry *val)

{
  Entry *pEVar1;
  IndexEntry *in_RCX;
  Clause *in_RDX;
  pair<Kernel::Literal_*,_Kernel::Clause_*> *in_RSI;
  uint *in_RDI;
  byte bVar2;
  bool exists;
  Entry *e;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  
  ensureExpanded((DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *)CONCAT17(in_stack_ffffffffffffffd7,
                             CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)));
  pEVar1 = findEntryToInsert((DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                              *)in_RDX,in_RSI);
  bVar2 = false;
  if ((uint)(pEVar1->field_0)._infoData >> 2 == *in_RDI) {
    bVar2 = ((pEVar1->field_0)._infoData & 1U) == 0;
  }
  if ((bool)bVar2 == false) {
    if ((uint)(pEVar1->field_0)._infoData >> 2 == *in_RDI) {
      in_RDI[2] = in_RDI[2] - 1;
    }
    else {
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 3U | *in_RDI << 2;
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffd;
    }
    (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffe;
    std::pair<Kernel::Literal_*,_Kernel::Clause_*>::operator=
              (&pEVar1->_key,(type)&stack0xfffffffffffffff0);
    pEVar1->_val = in_RCX;
    in_RDI[1] = in_RDI[1] + 1;
  }
  return (bool)((bVar2 ^ 0xff) & 1);
}

Assistant:

bool insert(Key key, Val val)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key = std::move(key);
      e->_val = std::move(val);
      _size++;
    }
    return !exists;

  }